

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autogenerated_settings.cpp
# Opt level: O2

void duckdb::DisableTimestamptzCastsSetting::ResetLocal(ClientContext *context)

{
  ClientConfig *pCVar1;
  ClientConfig local_200;
  
  switchD_014c3389::default(&local_200,0,0x1e8);
  ClientConfig::ClientConfig(&local_200);
  pCVar1 = ClientConfig::GetConfig(context);
  pCVar1->disable_timestamptz_casts = local_200.disable_timestamptz_casts;
  ClientConfig::~ClientConfig(&local_200);
  return;
}

Assistant:

void DisableTimestamptzCastsSetting::ResetLocal(ClientContext &context) {
	ClientConfig::GetConfig(context).disable_timestamptz_casts = ClientConfig().disable_timestamptz_casts;
}